

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspCliConfig::createOptions(ClaspCliConfig *this)

{
  byte_t *pbVar1;
  OptionsPtr *this_00;
  _Alloc_hider _Var2;
  OptionGroup *this_01;
  ProgOption *pPVar3;
  Value *pVVar4;
  OptionInitHelper local_48;
  string cmdName;
  
  if ((this->opts_).ptr_ < 2) {
    this_01 = (OptionGroup *)operator_new(0x40);
    std::__cxx11::string::string((string *)&cmdName,"",(allocator *)&local_48);
    Potassco::ProgramOptions::OptionGroup::OptionGroup(this_01,&cmdName,desc_level_default);
    this_00 = &this->opts_;
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::reset
              (this_00,this_01);
    std::__cxx11::string::~string((string *)&cmdName);
    cmdName._M_dataplus._M_p =
         (pointer)Potassco::ProgramOptions::OptionGroup::addOptions
                            ((OptionGroup *)((this->opts_).ptr_ & 0xfffffffffffffffe));
    pPVar3 = createOption(this,0);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"auto");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)&cmdName,"configuration",pVVar4,
               "Set default configuration [%D]\n      <arg>: {auto|frumpy|jumpy|tweety|handy|crafty|trendy|many|<file>}\n        auto  : Select configuration based on problem type\n        frumpy: Use conservative defaults\n        jumpy : Use aggressive defaults\n        tweety: Use defaults geared towards asp problems\n        handy : Use defaults geared towards large problems\n        crafty: Use defaults geared towards crafted problems\n        trendy: Use defaults geared towards industrial problems\n        many  : Use default portfolio to configure solver(s)\n        <file>: Use configuration file to configure solver(s)"
              );
    cmdName._M_dataplus._M_p = (pointer)&cmdName.field_2;
    cmdName._M_string_length = 0;
    cmdName.field_2._M_local_buf[0] = '\0';
    keyToCliName(&cmdName,"share","!,@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,1);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"auto");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure physical sharing of constraints [%D]\n      %A: {auto|problem|learnt|all}"
              );
    keyToCliName(&cmdName,"learn_explicit",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,2);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Do not use Short Implication Graph for learning");
    keyToCliName(&cmdName,"sat_prepro","!,@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,3);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    pVVar4 = Potassco::ProgramOptions::Value::implicit(pVVar4,"2");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Run SatELite-like preprocessing (Implicit: %I)\n      %A: <level>[,<limit>...]\n        <level> : Set preprocessing level to <level  {1..3}>\n          1: Variable elimination with subsumption (VE)\n          2: VE with limited blocked clause elimination (BCE)\n          3: Full BCE followed by VE\n        <limit> : [<key {iter|occ|time|frozen|clause}>=]<n> (0=no limit)\n          iter  : Set iteration limit to <n>           [0]\n          occ   : Set variable occurrence limit to <n> [0]\n          time  : Set time limit to <n> seconds        [0]\n          frozen: Set frozen variables limit to <n>%%   [0]\n          size  : Set size limit to <n>*1000 clauses   [4000]"
              );
    keyToCliName(&cmdName,"stats",",s");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,4);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"1");
    pVVar4 = Potassco::ProgramOptions::Value::arg(pVVar4,"<n>[,<t>]");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Enable {1=basic|2=full} statistics (<t> for tester)");
    keyToCliName(&cmdName,"parse_ext","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,5);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable extensions in non-aspif input");
    keyToCliName(&cmdName,"parse_maxsat","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,6);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Treat dimacs input as MaxSAT problem");
    keyToCliName(&cmdName,"opt_strategy","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,7);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure optimization strategy\n      %A: {bb|usc}[,<tactics>]\n        bb : Model-guided optimization with <tactics {lin|hier|inc|dec}> [lin]\n          lin : Basic lexicographical descent\n          hier: Hierarchical (highest priority criteria first) descent \n          inc : Hierarchical descent with exponentially increasing steps\n          dec : Hierarchical descent with exponentially decreasing steps\n        usc: Core-guided optimization with <tactics>: <relax>[,<opts>]\n          <relax>: Relaxation algorithm {oll|one|k|pmres}                [oll]\n            oll    : Use strategy from unclasp\n            one    : Add one cardinality constraint per core\n            k[,<n>]: Add cardinality constraints of bounded size ([0]=dynamic)\n            pmres  : Add clauses of size 3\n          <opts> : Tactics <list {disjoint|succinct|stratify}>|<mask {0..7}>\n            disjoint: Disjoint-core preprocessing                    (1)\n            succinct: No redundant (symmetry) constraints            (2)\n            stratify: Stratification heuristic for handling weights  (4)"
              );
    keyToCliName(&cmdName,"opt_usc_shrink","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,8);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Enable core-shrinking in core-guided optimization\n      %A: <algo>[,<limit> (0=no limit)]\n        <algo> : Use algorithm {lin|inv|bin|rgs|exp|min}\n          lin  : Forward linear search unsat\n          inv  : Inverse linear search not unsat\n          bin  : Binary search\n          rgs  : Repeated geometric sequence until unsat\n          exp  : Exponential search until unsat\n          min  : Linear search for subset minimal core\n        <limit>: Limit solve calls to 2^<n> conflicts [10]"
              );
    keyToCliName(&cmdName,"opt_heuristic","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,9);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<list>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Enable optimization heuristic\n      %A: {sign|model}\n        sign : Prefer signs minimizing objective\n        model: Assume literals minimizing objective after each model"
              );
    keyToCliName(&cmdName,"restart_on_model","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,10);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Restart after each model\n");
    keyToCliName(&cmdName,"lookahead","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0xb);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"atom");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure failed-literal detection (fld)\n      %A: <type>[,<limit>] / Implicit: %I\n        <type> : Run fld via {atom|body|hybrid} lookahead\n        <limit>: Disable fld after <limit> applications ([0]=no limit)\n      --lookahead=atom is default if --no-lookback is used\n"
              );
    keyToCliName(&cmdName,"heuristic","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0xc);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<heu>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure decision heuristic\n      %A: {Berkmin|Vmtf|Vsids|Domain|Unit|None}[,<n>]\n        Berkmin: Use BerkMin-like heuristic (Check last <n> nogoods [0]=all)\n        Vmtf   : Use Siege-like heuristic (Move <n> literals to the front [8])\n        Vsids  : Use Chaff-like heuristic (Use 1.0/0.<n> as decay factor  [95])\n        Domain : Use domain knowledge in Vsids-like heuristic\n        Unit   : Use Smodels-like heuristic (Default if --no-lookback)\n        None   : Select the first free variable"
              );
    keyToCliName(&cmdName,"init_moms","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0xd);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Initialize heuristic with MOMS-score");
    keyToCliName(&cmdName,"score_res",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0xe);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<score>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Resolution score {auto|min|set|multiset}");
    keyToCliName(&cmdName,"score_other",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0xf);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Score other learnt nogoods: {auto|no|loop|all}");
    keyToCliName(&cmdName,"sign_def",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x10);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<sign>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Default sign: {asp|pos|neg|rnd}");
    keyToCliName(&cmdName,"sign_fix","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x11);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Disable sign heuristics and use default signs only");
    keyToCliName(&cmdName,"berk_huang","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x12);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable Huang-scoring in Berkmin");
    keyToCliName(&cmdName,"vsids_acids","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x13);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable acids-scheme in Vsids/Domain");
    keyToCliName(&cmdName,"vsids_progress",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x14);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Enable dynamic decaying scheme in Vsids/Domain\n      %A: <n>[,<i {1..100}>][,<c>]|(0=disable)\n        <n> : Set initial decay factor to 1.0/0.<n>\n        <i> : Set decay update to <i>/100.0      [1]\n        <c> : Decrease decay every <c> conflicts [5000]"
              );
    keyToCliName(&cmdName,"nant","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x15);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Prefer negative antecedents of P in heuristic");
    keyToCliName(&cmdName,"dom_mod",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x16);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Default modification for domain heuristic\n      %A: (no|<mod>[,<pick>])\n        <mod>  : Modifier {level|pos|true|neg|false|init|factor}\n        <pick> : Apply <mod> to (all | <list {scc|hcc|disj|opt|show}>) atoms"
              );
    keyToCliName(&cmdName,"save_progress","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x17);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"1");
    pVVar4 = Potassco::ProgramOptions::Value::arg(pVVar4,"<n>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Use RSat-like progress saving on backjumps > %A");
    keyToCliName(&cmdName,"init_watches",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x18);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Watched literal initialization: {rnd|first|least}");
    keyToCliName(&cmdName,"update_mode",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x19);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<mode>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Process messages on {propagate|conflict}");
    keyToCliName(&cmdName,"acyc_prop",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1a);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"1");
    pVVar4 = Potassco::ProgramOptions::Value::arg(pVVar4,"{0..1}");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Use backward inference in acyc propagation");
    keyToCliName(&cmdName,"seed","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1b);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Set random number generator\'s seed to %A");
    keyToCliName(&cmdName,"no_lookback","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1c);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Disable all lookback strategies\n");
    keyToCliName(&cmdName,"forget_on_step","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1d);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<opts>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure forgetting on (incremental) step\n      %A: <list {varScores|signs|lemmaScores|lemmas}>|<mask {0..15}>\n"
              );
    keyToCliName(&cmdName,"strengthen","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1e);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<X>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Use MiniSAT-like conflict nogood strengthening\n      %A: <mode>[,<type>][,<bump {yes|no}>]\n        <mode>: Use {local|recursive} self-subsumption check\n        <type>: Follow {all|short|binary} antecedents [all]\n        <bump>: Bump activities of antecedents        [yes]"
              );
    keyToCliName(&cmdName,"otfs","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x1f);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"1");
    pVVar4 = Potassco::ProgramOptions::Value::arg(pVVar4,"{0..2}");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Enable {1=partial|2=full} on-the-fly subsumption");
    keyToCliName(&cmdName,"update_lbd","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x20);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure LBD updates during conflict resolution\n      %A: <mode {less|glucose|pseudo}>[,<n {0..127}>]\n        less   : update to X = new LBD   iff X   < previous LBD\n        glucose: update to X = new LBD   iff X+1 < previous LBD\n        pseudo : update to X = new LBD+1 iff X   < previous LBD\n           <n> : Protect updated nogoods on next reduce if X <= <n>"
              );
    keyToCliName(&cmdName,"update_act",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x21);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable LBD-based activity bumping");
    keyToCliName(&cmdName,"reverse_arcs","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x22);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"1");
    pVVar4 = Potassco::ProgramOptions::Value::arg(pVVar4,"{0..3}");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Enable ManySAT-like inverse-arc learning");
    keyToCliName(&cmdName,"contraction","!,@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x23);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure handling of long learnt nogoods\n      %A: <n>[,<rep>]\n        <n>  : Contract nogoods if size > <n> (0=disable)\n        <rep>: Nogood replacement {no|decisionSeq|allUIP|dynamic} [no]\n"
              );
    keyToCliName(&cmdName,"loops","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x24);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<type>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure learning of loop nogoods\n      %A: {common|distinct|shared|no}\n        common  : Create loop nogoods for atoms in an unfounded set\n        distinct: Create distinct loop nogood for each atom in an unfounded set\n        shared  : Create loop formula for a whole unfounded set\n        no      : Do not learn loop formulas\n"
              );
    keyToCliName(&cmdName,"partial_check","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x25);
    pVVar4 = Potassco::ProgramOptions::Value::implicit(&pPVar3->super_Value,"50");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure partial stability tests\n      %A: <p>[,<h>] / Implicit: %I\n        <p>: Partial check skip percentage\n        <h>: Init/update value for high bound ([0]=umax)"
              );
    keyToCliName(&cmdName,"sign_def_disj",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x26);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<sign>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Default sign for atoms in disjunctions");
    keyToCliName(&cmdName,"rand_freq","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x27);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<p>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Make random decisions with probability %A");
    keyToCliName(&cmdName,"rand_prob","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x28);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>[,<m>]");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Do <n> random searches with [<m>=100] conflicts");
    keyToCliName(&cmdName,"restarts","!,r");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x29);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<sched>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure restart policy\n      %A: <type {F|L|x|+}>,<n {1..umax}>[,<args>][,<lim>]\n        F,<n>    : Run fixed sequence of <n> conflicts\n        L,<n>    : Run Luby et al.\'s sequence with unit length <n>\n        x,<n>,<f>: Run geometric seq. of <n>*(<f>^i) conflicts  (<f> >= 1.0)\n        +,<n>,<m>: Run arithmetic seq. of <n>+(<m>*i) conflicts (<m {0..umax}>)\n        ...,<lim>: Repeat sequence every <lim>+j restarts       (<type> != F)\n      %A: D,<n>,<K>[,<args>]: Dynamic restarts based on moving LBD average\n        <n>      : Fast moving average window size\n        <K>      : Fast margin (restart if fastAvg * <K> > slowAvg)\n        <L>      : LBD average limit                                [0 = none]\n        <f>      : Fast moving average type                         [d = SMA]\n          d      : Default\n          e|l    : EMA with alpha = 2/(<n>+1) or 1/log2(<n>)\n          es|ls  : e or l with exponentially decreasing alpha for first samples\n        <k>      : keep fast moving average on (r)estarts/(b)locks  [n = never]\n        <s>      : slow moving average type                         [d = CMA]\n        <w>      : slow moving average window size (<s> != d)       [200*<n>]\n      no|0       : Disable restarts"
              );
    keyToCliName(&cmdName,"reset_restarts",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2a);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Update restart seq. on model {no|repeat|disable}");
    keyToCliName(&cmdName,"local_restarts","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2b);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Use Ryvchin et al.\'s local restarts");
    keyToCliName(&cmdName,"counter_restarts","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2c);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Use counter implication restarts\n      %A: (<rate>[,<bump>] | {0|no})\n      <rate>: Interval in number of restarts\n      <bump>: Bump factor applied to indegrees"
              );
    keyToCliName(&cmdName,"block_restarts","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2d);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Use glucose-style blocking restarts\n      %A: <n>[,<R {1.0..5.0}>][,<c>][,<a>]\n        <n>: Window size for moving average (0=disable blocking)\n        <R>: Block restart if assignment > average * <R>  [1.4]\n        <c>: Disable blocking for the first <c> conflicts [10000]\n        <a>: Type of moving average (see restarts)        [e]\n"
              );
    keyToCliName(&cmdName,"shuffle","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2e);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n1>,<n2>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Shuffle problem after <n1>+(<n2>*i) restarts\n");
    keyToCliName(&cmdName,"deletion","!,d");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x2f);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"basic,75,activity");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure deletion algorithm [%D]\n      %A: <algo>[,<n {1..100}>][,<sc>]\n        <algo>: Use {basic|sort|ipSort|ipHeap} algorithm\n        <n>   : Delete at most <n>%% of nogoods on reduction    [75]\n        <sc>  : Use {activity|lbd|mixed} nogood scores    [activity]\n      no      : Disable nogood deletion"
              );
    keyToCliName(&cmdName,"del_grow","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x30);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Configure size-based deletion policy\n      %A: <f>[,<g>][,<sched>] (<f> >= 1.0)\n        <f>     : Keep at most T = X*(<f>^i) learnt nogoods with X being the\n                  initial limit and i the number of times <sched> fired\n        <g>     : Stop growth once T > P*<g> (0=no limit)      [3.0]\n        <sched> : Set grow schedule (<type {F|L|x|+}>) [grow on restart]"
              );
    keyToCliName(&cmdName,"del_cfl","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x31);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<sched>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure conflict-based deletion policy\n      %A:   <type {F|L|x|+}>,<args>... (see restarts)"
              );
    keyToCliName(&cmdName,"del_init","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x32);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"3.0");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure initial deletion limit\n      %A: <f>[,<n>,<o>] (<f> > 0)\n        <f>    : Set initial limit to P=estimated problem size/<f> [%D]\n        <n>,<o>: Clamp initial limit to the range [<n>,<n>+<o>]"
              );
    keyToCliName(&cmdName,"del_estimate","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x33);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"0..3");
    pVVar4 = Potassco::ProgramOptions::Value::implicit(pVVar4,"1");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Use estimated problem complexity in limits");
    keyToCliName(&cmdName,"del_max","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x34);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>,<X>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Keep at most <n> learnt nogoods taking up to <X> MB");
    keyToCliName(&cmdName,"del_glue","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x35);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Configure glue clause handling\n      %A: <n {0..15}>[,<m {0|1}>]\n        <n>: Do not delete nogoods with LBD <= <n>\n        <m>: Count (0) or ignore (1) glue clauses in size limit [0]"
              );
    keyToCliName(&cmdName,"del_on_restart","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x36);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Delete %A%% of learnt nogoods on each restart");
    keyToCliName(&cmdName,"trans_ext","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x37);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<mode>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure handling of extended rules\n      %A: {all|choice|card|weight|integ|dynamic}\n        all    : Transform all extended rules to basic rules\n        choice : Transform choice rules, but keep cardinality and weight rules\n        card   : Transform cardinality rules, but keep choice and weight rules\n        weight : Transform cardinality and weight rules, but keep choice rules\n        scc    : Transform \"recursive\" cardinality and weight rules\n        integ  : Transform cardinality integrity constraints\n        dynamic: Transform \"simple\" extended rules, but keep more complex ones"
              );
    keyToCliName(&cmdName,"eq","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x38);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure equivalence preprocessing\n      Run for at most %A iterations (-1=run to fixpoint)"
              );
    keyToCliName(&cmdName,"backprop","!,@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x39);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Use backpropagation in ASP-preprocessing")
    ;
    keyToCliName(&cmdName,"supp_models",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3a);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Compute supported models");
    keyToCliName(&cmdName,"no_ufs_check",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3b);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Disable unfounded set check");
    keyToCliName(&cmdName,"no_gamma",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3c);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,
               "Do not add gamma rules for non-hcf disjunctions");
    keyToCliName(&cmdName,"eq_dfs",",@2");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3d);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable df-order in eq-preprocessing");
    keyToCliName(&cmdName,"dlp_old_map",",@3");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3e);
    pbVar1 = &(pPVar3->super_Value).flags_;
    *pbVar1 = *pbVar1 | 3;
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,&pPVar3->super_Value,"Enable old mapping for disjunctive LPs");
    keyToCliName(&cmdName,"solve_limit",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x3f);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>[,<m>]");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Stop search after <n> conflicts or <m> restarts\n");
    keyToCliName(&cmdName,"parallel_mode",",t");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x40);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Run parallel search with given number of threads\n      %A: <n {1..64}>[,<mode {compete|split}>]\n        <n>   : Number of threads to use in search\n        <mode>: Run competition or splitting based search [compete]\n"
              );
    keyToCliName(&cmdName,"global_restarts",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x41);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<X>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure global restart policy\n      %A: <n>[,<sched>]\n        <n> : Maximal number of global restarts (0=disable)\n     <sched>: Restart schedule [x,100,1.5] (<type {F|L|x|+}>)\n"
              );
    keyToCliName(&cmdName,"distribute","!,@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x42);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"conflict,global,4");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure nogood distribution [%D]\n      %A: <type>[,<mode>][,<lbd {0..127}>][,<size>]\n        <type> : Distribute {all|short|conflict|loop} nogoods\n        <mode> : Use {global|local} distribution   [global]\n        <lbd>  : Distribute only if LBD  <= <lbd>  [4]\n        <size> : Distribute only if size <= <size> [-1]"
              );
    keyToCliName(&cmdName,"integrate",",@1");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x43);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"gp");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure nogood integration [%D]\n      %A: <pick>[,<n>][,<topo>]\n        <pick>: Add {all|unsat|gp(unsat wrt guiding path)|active} nogoods\n        <n>   : Always keep at least last <n> integrated nogoods   [1024]\n        <topo>: Accept nogoods from {all|ring|cube|cubex} peers    [all]\n"
              );
    keyToCliName(&cmdName,"enum_mode",",e");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x44);
    pVVar4 = Potassco::ProgramOptions::Value::defaultsTo(&pPVar3->super_Value,"auto");
    pVVar4->state_ = '\x01';
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure enumeration algorithm [%D]\n      %A: {bt|record|brave|cautious|auto}\n        bt      : Backtrack decision literals from solutions\n        record  : Add nogoods for computed solutions\n        domRec  : Add nogoods over true domain atoms\n        brave   : Compute brave consequences (union of models)\n        cautious: Compute cautious consequences (intersection of models)\n        auto    : Use bt for enumeration and record for optimization"
              );
    keyToCliName(&cmdName,"project","!");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x45);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    pVVar4 = Potassco::ProgramOptions::Value::implicit(pVVar4,"auto,3");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Enable projective solution enumeration\n      %A: {show|project|auto}[,<bt {0..3}>] (Implicit: %I)\n        Project to atoms in show or project directives, or\n        select depending on the existence of a project directive\n      <bt> : Additional options for enumeration algorithm \'bt\'\n        Use activity heuristic (1) when selecting backtracking literal\n        and/or progress saving (2) when retracting solution literals"
              );
    keyToCliName(&cmdName,"models",",n");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x46);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<n>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Compute at most %A models (0 for all)\n");
    keyToCliName(&cmdName,"opt_mode","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x47);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<arg>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,
               "Configure optimization algorithm\n      %A: <mode {opt|enum|optN|ignore}>[,<bound>...]\n        opt   : Find optimal model\n        enum  : Find models with costs <= <bound>\n        optN  : Find optimum, then enumerate optimal models\n        ignore: Ignore optimize statements\n      <bound> : Set initial bound for objective function(s)"
              );
    keyToCliName(&cmdName,"opt_stop","");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    _Var2 = cmdName._M_dataplus;
    pPVar3 = createOption(this,0x48);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<bound>...");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,_Var2._M_p,pVVar4,"Stop optimization on model with cost <= <bound> \n");
    local_48 = Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)(this_00->ptr_ & 0xfffffffffffffffe));
    pPVar3 = createOption(this,0x49);
    pVVar4 = Potassco::ProgramOptions::Value::arg(&pPVar3->super_Value,"<options>");
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (&local_48,"tester",pVVar4,"Pass (quoted) string of %A to tester");
    std::__cxx11::string::~string((string *)&cmdName);
  }
  return;
}

Assistant:

void ClaspCliConfig::createOptions() {
	if (opts_.get()) { return; }
	opts_ = new Options();
	using namespace Potassco::ProgramOptions;
	opts_->addOptions()("configuration", createOption(meta_config)->defaultsTo("auto")->state(Value::value_defaulted), KEY_INIT_DESC("Set default configuration [%D]\n"));
	std::string cmdName;
#define CLASP_ALL_GROUPS
#define OPTION(k, e, a, d, ...) keyToCliName(cmdName, #k, e); opts_->addOptions()(cmdName.c_str(),static_cast<ProgOption*>( createOption(opt_##k)a ), d);
#define ARG(a) ->a
#define ARG_EXT(a, X) ARG(a)
#define NO_ARG
#include <clasp/cli/clasp_cli_options.inl>
	opts_->addOptions()("tester", createOption(meta_tester)->arg("<options>"), "Pass (quoted) string of %A to tester");
}